

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void diy::
     Serialization<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>::
     save(BinaryBuffer *bb,Vector *v)

{
  pointer pPVar1;
  size_t s;
  
  s = ((long)(v->super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)(v->super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>).
            _M_impl.super__Vector_impl_data._M_start) / 0xc;
  (*bb->_vptr_BinaryBuffer[2])(bb,&s,8);
  if (s != 0) {
    pPVar1 = (v->super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    (*bb->_vptr_BinaryBuffer[2])
              (bb,pPVar1,
               (long)(v->
                     super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }